

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O3

reference __thiscall
slang::SmallVectorBase<slang::SmallVector<int,_10UL>_>::emplace_back<>
          (SmallVectorBase<slang::SmallVector<int,_10UL>_> *this)

{
  pointer pSVar1;
  ulong uVar2;
  SmallVector<int,_10UL> *pSVar3;
  long *plVar4;
  size_type sVar5;
  SmallVector<int,_10UL> *pSVar6;
  Base *ctx;
  Base *pBVar7;
  Base *other;
  Base *other_00;
  long lVar8;
  
  pSVar1 = this->data_;
  sVar5 = this->len;
  other_00 = &pSVar1[sVar5].super_SmallVectorBase<int>;
  if (sVar5 != this->cap) {
    ((SmallVectorBase<int> *)&other_00->data_)->data_ = (pointer)other_00->firstElement;
    other_00->len = 0;
    other_00->cap = 10;
    this->len = sVar5 + 1;
    return pSVar1 + sVar5;
  }
  if (this->len == 0x1ffffffffffffff) {
    detail::throwLengthError();
  }
  pBVar7 = (Base *)(this->len + 1);
  uVar2 = this->cap;
  ctx = (Base *)(uVar2 * 2);
  if (pBVar7 < ctx) {
    pBVar7 = ctx;
  }
  if (0x1ffffffffffffff - uVar2 < uVar2) {
    pBVar7 = (Base *)0x1ffffffffffffff;
  }
  lVar8 = (long)other_00 - (long)this->data_;
  pSVar3 = (SmallVector<int,_10UL> *)operator_new((long)pBVar7 << 6);
  plVar4 = (long *)((long)pSVar3 + lVar8);
  *plVar4 = (long)(plVar4 + 3);
  plVar4[1] = 0;
  plVar4[2] = 10;
  other = &this->data_->super_SmallVectorBase<int>;
  sVar5 = this->len;
  if (other + sVar5 * 2 == other_00) {
    pSVar6 = pSVar3;
    if (sVar5 != 0) {
      do {
        ctx = other;
        SmallVector<int,_10UL>::SmallVector(pSVar6,other);
        other = other + 2;
        pSVar6 = pSVar6 + 1;
      } while (other != other_00);
    }
  }
  else {
    pSVar6 = pSVar3;
    if (other != other_00) {
      do {
        ctx = other;
        SmallVector<int,_10UL>::SmallVector(pSVar6,other);
        other = other + 2;
        pSVar6 = pSVar6 + 1;
      } while (other != other_00);
      other = &this->data_->super_SmallVectorBase<int>;
      sVar5 = this->len;
    }
    if (other + sVar5 * 2 != other_00) {
      pSVar6 = (SmallVector<int,_10UL> *)(lVar8 + (long)pSVar3);
      do {
        pSVar6 = pSVar6 + 1;
        ctx = other_00;
        SmallVector<int,_10UL>::SmallVector(pSVar6,other_00);
        other_00 = other_00 + 2;
      } while (other_00 != other + sVar5 * 2);
    }
  }
  cleanup(this,(EVP_PKEY_CTX *)ctx);
  this->len = this->len + 1;
  this->cap = (size_type)pBVar7;
  this->data_ = pSVar3;
  return (reference)((long)pSVar3 + lVar8);
}

Assistant:

[[nodiscard]] constexpr iterator end() noexcept { return data_ + len; }